

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-parse.c
# Opt level: O0

int fy_fetch_plain_scalar(fy_parser *fyp,int c)

{
  long lVar1;
  bool bVar2;
  fy_parser *fyp_00;
  _Bool _Var3;
  int iVar4;
  int iVar5;
  void *pvVar6;
  fy_atom *pfVar7;
  size_t sVar8;
  fy_token *fyt_00;
  char *pcVar9;
  undefined1 auStack_388 [48];
  char *local_358 [2];
  char acStack_348 [8];
  fy_atom *local_340;
  fy_parser *local_338;
  size_t local_330;
  size_t local_328;
  bool local_31e;
  _Bool local_31d;
  int local_31c;
  undefined1 auStack_318 [8];
  fy_diag_report_ctx _drc_10;
  undefined1 auStack_2e8 [8];
  fy_diag_report_ctx _drc_9;
  undefined1 auStack_2b8 [8];
  fy_diag_report_ctx _drc_8;
  char *_out;
  size_t _outsz;
  fy_utf8_escape __esc;
  size_t __len;
  char *__buf;
  fy_diag_report_ctx _drc_7;
  undefined1 auStack_228 [8];
  fy_diag_report_ctx _drc_6;
  undefined1 auStack_1f8 [8];
  fy_diag_report_ctx _drc_5;
  undefined1 auStack_1c8 [8];
  fy_diag_report_ctx _drc_4;
  undefined1 auStack_198 [8];
  fy_diag_report_ctx _drc_3;
  undefined1 auStack_168 [8];
  fy_diag_report_ctx _drc_2;
  undefined1 auStack_138 [8];
  fy_diag_report_ctx _drc_1;
  undefined1 auStack_108 [8];
  fy_diag_report_ctx _drc;
  size_t tlength;
  fy_token *fyt;
  fy_simple_key_mark skm;
  undefined1 local_a8;
  _Bool has_json_esc;
  _Bool is_json_unesc;
  _Bool has_ws;
  _Bool has_lb;
  _Bool is_complex;
  _Bool is_multiline;
  _Bool target_simple_key_allowed;
  fy_mark last_mark;
  fy_mark mark;
  char *last_ptr;
  _Bool had_breaks;
  int iStack_78;
  _Bool has_leading_blanks;
  int blanks_found;
  int breaks_found;
  int i;
  int nextc;
  int run;
  int indent;
  int rc;
  size_t length;
  fy_atom handle;
  int c_local;
  fy_parser *fyp_local;
  
  handle._52_4_ = c;
  if (fyp->state == FYPS_BLOCK_MAPPING_VALUE) {
    local_358[1] = (char *)0x148042;
    _Var3 = fy_is_tab(c);
    if (_Var3) {
      _drc.fyt = (fy_token *)0x0;
      _drc.has_override = false;
      _drc._17_7_ = 0;
      _drc.type = FYET_DEBUG;
      _drc.module = FYEM_UNKNOWN;
      _drc.override_file = (char *)0x0;
      auStack_108._0_4_ = FYET_ERROR;
      auStack_108._4_4_ = FYEM_SCAN;
      pfVar7 = fy_fill_atom_at(fyp,0,1,(fy_atom *)auStack_388);
      _drc._0_8_ = fy_token_create(FYTT_INPUT_MARKER,pfVar7);
      fy_parser_diag_report
                (fyp,(fy_diag_report_ctx *)auStack_108,"invalid tab as indendation in a mapping");
      return -1;
    }
  }
  local_358[1] = (char *)0x1480db;
  _Var3 = fyp_is_blankz(fyp,handle._52_4_);
  if (_Var3) {
    _drc_1.fyt = (fy_token *)0x0;
    _drc_1.has_override = false;
    _drc_1._17_7_ = 0;
    _drc_1.type = FYET_DEBUG;
    _drc_1.module = FYEM_UNKNOWN;
    _drc_1.override_file = (char *)0x0;
    auStack_138._0_4_ = FYET_ERROR;
    auStack_138._4_4_ = FYEM_SCAN;
    pfVar7 = fy_fill_atom_at(fyp,0,1,(fy_atom *)auStack_388);
    _drc_1._0_8_ = fy_token_create(FYTT_INPUT_MARKER,pfVar7);
    fy_parser_diag_report
              (fyp,(fy_diag_report_ctx *)auStack_138,"plain scalar cannot start with blank or zero")
    ;
  }
  else {
    local_358[1] = (char *)0x148177;
    pvVar6 = fy_utf8_strchr(",[]{}#&*!|>\'\"%@`",handle._52_4_);
    if (pvVar6 == (void *)0x0) {
      if (handle._52_4_ == 0x2d) {
        local_358[1] = (char *)0x148220;
        _Var3 = fy_is_blank_at_offset(fyp,1);
        if (_Var3) {
          _drc_3.fyt = (fy_token *)0x0;
          _drc_3.has_override = false;
          _drc_3._17_7_ = 0;
          _drc_3.type = FYET_DEBUG;
          _drc_3.module = FYEM_UNKNOWN;
          _drc_3.override_file = (char *)0x0;
          auStack_198._0_4_ = FYET_ERROR;
          auStack_198._4_4_ = FYEM_SCAN;
          pfVar7 = fy_fill_atom_at(fyp,0,2,(fy_atom *)auStack_388);
          _drc_3._0_8_ = fy_token_create(FYTT_INPUT_MARKER,pfVar7);
          fy_parser_diag_report
                    (fyp,(fy_diag_report_ctx *)auStack_198,
                     "plain scalar cannot start with \'%c\' followed by blank",
                     (ulong)(uint)handle._52_4_);
          return -1;
        }
      }
      if ((fyp->flow_level == 0) && ((handle._52_4_ == 0x3f || (handle._52_4_ == 0x3a)))) {
        local_358[1] = (char *)0x1482dc;
        _Var3 = fy_is_blank_at_offset(fyp,1);
        if (_Var3) {
          _drc_4.fyt = (fy_token *)0x0;
          _drc_4.has_override = false;
          _drc_4._17_7_ = 0;
          _drc_4.type = FYET_DEBUG;
          _drc_4.module = FYEM_UNKNOWN;
          _drc_4.override_file = (char *)0x0;
          auStack_1c8._0_4_ = FYET_ERROR;
          auStack_1c8._4_4_ = FYEM_SCAN;
          pfVar7 = fy_fill_atom_at(fyp,0,2,(fy_atom *)auStack_388);
          _drc_4._0_8_ = fy_token_create(FYTT_INPUT_MARKER,pfVar7);
          fy_parser_diag_report
                    (fyp,(fy_diag_report_ctx *)auStack_1c8,
                     "plain scalar cannot start with \'%c\' followed by blank (in block context)",
                     (ulong)(uint)handle._52_4_);
          return -1;
        }
      }
      if ((fyp->flow_level == 0) || (fyp->indent < fyp->column)) {
        local_358[1] = (char *)0x148442;
        fy_get_mark(fyp,(fy_mark *)&last_mark.line);
        skm.flow_level._3_1_ = 0;
        local_358[1] = (char *)0x148459;
        fy_get_simple_key_mark(fyp,(fy_simple_key_mark *)&fyt);
        local_358[1] = (char *)0x148466;
        fy_fill_atom_start(fyp,(fy_atom *)&length);
        bVar2 = false;
        last_ptr._2_1_ = 0;
        skm.flow_level._0_1_ = 0;
        skm._19_1_ = 0;
        skm._17_1_ = 0;
        _indent = 0;
        iStack_78 = 0;
        last_ptr._4_4_ = 0;
        iVar4 = fyp->indent + 1;
        mark.line = 0;
        mark.column = 0;
        local_358[1] = (char *)0x1484c4;
        memset(&local_a8,0,0x10);
        handle._52_4_ = 0xffffffff;
        do {
          if (fyp->column == 0) {
            local_358[1] = (char *)0x1484ea;
            iVar5 = fy_parse_strncmp(fyp,"---",3);
            if (iVar5 != 0) {
              local_358[1] = (char *)0x148504;
              iVar5 = fy_parse_strncmp(fyp,"...",3);
              if (iVar5 != 0) goto LAB_00148522;
            }
            local_358[1] = (char *)0x148517;
            _Var3 = fy_is_blankz_at_offset(fyp,3);
            if (_Var3) break;
          }
LAB_00148522:
          local_358[1] = (char *)0x14852b;
          handle._52_4_ = fy_parse_peek(fyp);
          if (handle._52_4_ == 0x23) break;
          i = 0;
          while( true ) {
            local_358[1] = (char *)0x14854c;
            _Var3 = fyp_is_blankz(fyp,handle._52_4_);
            if (_Var3) break;
            local_358[1] = (char *)0x148565;
            iVar5 = fy_parse_peek_at(fyp,1);
            if (handle._52_4_ == 0x3a) {
              local_358[1] = (char *)0x14857a;
              _Var3 = fyp_is_blankz(fyp,iVar5);
              if (_Var3) break;
            }
            if ((fyp->flow_level != 0) && (handle._52_4_ == 0x3a)) {
              local_358[1] = (char *)0x1485a4;
              pvVar6 = fy_utf8_strchr(",[]{}",iVar5);
              if (pvVar6 != (void *)0x0) break;
            }
            if ((fyp->flow_level != 0) &&
               ((((handle._52_4_ == 0x2c || (handle._52_4_ == 0x5b)) || (handle._52_4_ == 0x5d)) ||
                ((handle._52_4_ == 0x7b || (handle._52_4_ == 0x7d)))))) break;
            if (iStack_78 == 0) {
              if (last_ptr._4_4_ != 0) {
                _indent = (long)last_ptr._4_4_ + _indent;
                last_ptr._4_4_ = 0;
              }
            }
            else {
              if (iStack_78 < 2) {
                local_31c = 1;
              }
              else {
                local_31c = iStack_78 + -1;
              }
              _indent = (long)local_31c + _indent;
              iStack_78 = 0;
              last_ptr._4_4_ = 0;
            }
            local_358[1] = (char *)0x148646;
            skm._18_1_ = fy_is_json_unescaped(handle._52_4_);
            if (!(bool)skm._18_1_) {
              skm._17_1_ = 1;
            }
            local_358[1] = (char *)0x14866a;
            fy_advance(fyp,handle._52_4_);
            i = i + 1;
            local_358[1] = (char *)0x14867b;
            sVar8 = fy_utf8_width(handle._52_4_);
            _indent = sVar8 + _indent;
            handle._52_4_ = iVar5;
          }
          if (0 < i) {
            mark._8_8_ = fyp->current_ptr;
            local_358[1] = (char *)0x1486b0;
            fy_get_mark(fyp,(fy_mark *)&local_a8);
          }
          local_358[1] = (char *)0x1486b8;
          _Var3 = fy_is_blank(handle._52_4_);
          if (!_Var3) {
            local_358[1] = (char *)0x1486c8;
            _Var3 = fyp_is_lb(fyp,handle._52_4_);
            if (!_Var3) break;
          }
          skm._17_1_ = 1;
          iStack_78 = 0;
          last_ptr._4_4_ = 0;
          do {
            local_358[1] = (char *)0x1486f2;
            fy_advance(fyp,handle._52_4_);
            if (((fyp->tabsize == 0) && (handle._52_4_ == 9)) && ((bVar2 && (fyp->column < iVar4))))
            {
              _drc_6.fyt = (fy_token *)0x0;
              _drc_6.has_override = false;
              _drc_6._17_7_ = 0;
              _drc_6.type = FYET_DEBUG;
              _drc_6.module = FYEM_UNKNOWN;
              _drc_6.override_file = (char *)0x0;
              auStack_228._0_4_ = FYET_ERROR;
              auStack_228._4_4_ = FYEM_SCAN;
              pfVar7 = fy_fill_atom_at(fyp,0,1,(fy_atom *)auStack_388);
              _drc_6._0_8_ = fy_token_create(FYTT_INPUT_MARKER,pfVar7);
              fy_parser_diag_report
                        (fyp,(fy_diag_report_ctx *)auStack_228,"invalid tab used as indentation");
              return -1;
            }
            local_358[1] = (char *)0x1487b3;
            iVar5 = fy_parse_peek(fyp);
            local_358[1] = (char *)0x1487c2;
            _Var3 = fyp_is_lb(fyp,handle._52_4_);
            if (_Var3) {
              if (!bVar2) {
                bVar2 = true;
              }
              last_ptr._2_1_ = 1;
              iStack_78 = iStack_78 + 1;
              last_ptr._4_4_ = 0;
              skm.flow_level._0_1_ = 1;
            }
            else {
              last_ptr._4_4_ = last_ptr._4_4_ + 1;
              skm._19_1_ = 1;
            }
            local_358[1] = (char *)0x14880d;
            handle._52_4_ = iVar5;
            _Var3 = fy_is_blank(iVar5);
            local_31d = true;
            if (!_Var3) {
              local_358[1] = (char *)0x148828;
              local_31d = fyp_is_lb(fyp,handle._52_4_);
            }
          } while (local_31d != false);
        } while ((fyp->flow_level != 0) || (iVar4 <= fyp->column));
        if (mark._8_8_ == 0) {
          local_358[1] = (char *)0x14886d;
          fy_fill_atom_end(fyp,(fy_atom *)&length);
        }
        else {
          local_358[1] = (char *)0x148883;
          fy_fill_atom_end_at(fyp,(fy_atom *)&length,(fy_mark *)&local_a8);
        }
        if ((handle._52_4_ == -2) || (handle._52_4_ == -3)) {
          _drc_7.fyt = (fy_token *)0x0;
          _drc_7.has_override = false;
          _drc_7._17_7_ = 0;
          _drc_7.type = FYET_DEBUG;
          _drc_7.module = FYEM_UNKNOWN;
          _drc_7.override_file = (char *)0x0;
          __buf = (char *)0x200000004;
          pfVar7 = fy_fill_atom_mark(fyp->current_input,(fy_mark *)&length,
                                     (fy_mark *)&handle.start_mark.line,(fy_atom *)auStack_388);
          _drc_7._0_8_ = fy_token_create(FYTT_INPUT_MARKER,pfVar7);
          fy_parser_diag_report(fyp,(fy_diag_report_ctx *)&__buf,"plain scalar is malformed UTF8");
        }
        else {
          skm.flow_level._2_1_ = (int)handle.start_mark.input_pos < (int)handle.end_mark.input_pos;
          skm.flow_level._1_1_ = -1 < fyp->pending_complex_key_column;
          handle.fyi._4_4_ = handle.fyi._4_4_ & 0xfffffc00;
          local_31e = false;
          if ((!(bool)skm.flow_level._2_1_) && (local_31e = false, (skm._17_1_ & 1) == 0)) {
            local_358[1] = (char *)0x148981;
            sVar8 = fy_atom_size((fy_atom *)&length);
            local_31e = sVar8 == _indent;
          }
          handle.fyi._4_4_ =
               handle.fyi._4_4_ & 0xfc000bff | (uint)local_31e << 10 |
               (uint)((byte)skm.flow_level & 1) << 0xd | (uint)(skm._19_1_ & 1) << 0xe |
               (uint)(_indent == 0) << 0x14 | (fyp->tabsize & 0xfU) << 0x16;
          local_358[1] = (char *)0x148a81;
          iVar4 = fy_atom_format_text_length((fy_atom *)&length);
          local_330 = (size_t)iVar4;
          if (local_330 == _indent) {
            handle.end_mark.line = indent;
            handle.end_mark.column = rc;
            handle.fyi._4_4_ = handle.fyi._4_4_ & 0xfffff7ff | 0x800;
            local_358[1] = (char *)0x148be3;
            _Var3 = fyp_json_mode(fyp);
            if (_Var3) {
              if ((skm.flow_level._2_1_ & 1) != 0) {
                _drc_8.fyt = (fy_token *)0x0;
                _drc_8.has_override = false;
                _drc_8._17_7_ = 0;
                _drc_8.type = FYET_DEBUG;
                _drc_8.module = FYEM_UNKNOWN;
                _drc_8.override_file = (char *)0x0;
                auStack_2b8._0_4_ = FYET_ERROR;
                auStack_2b8._4_4_ = FYEM_SCAN;
                pfVar7 = fy_fill_atom_mark(fyp->current_input,(fy_mark *)&length,
                                           (fy_mark *)&handle.start_mark.line,(fy_atom *)auStack_388
                                          );
                _drc_8._0_8_ = fy_token_create(FYTT_INPUT_MARKER,pfVar7);
                fy_parser_diag_report
                          (fyp,(fy_diag_report_ctx *)auStack_2b8,
                           "Multi line plain scalars not supported in JSON mode");
                return -1;
              }
              local_358[1] = (char *)0x148c94;
              iVar4 = fy_atom_strcmp((fy_atom *)&length,"false");
              if (iVar4 != 0) {
                local_358[1] = (char *)0x148cad;
                iVar4 = fy_atom_strcmp((fy_atom *)&length,"true");
                if (iVar4 != 0) {
                  local_358[1] = (char *)0x148cc6;
                  iVar4 = fy_atom_strcmp((fy_atom *)&length,"null");
                  if (iVar4 != 0) {
                    local_358[1] = (char *)0x148cd8;
                    _Var3 = fy_atom_is_number((fy_atom *)&length);
                    if (!_Var3) {
                      _drc_9.fyt = (fy_token *)0x0;
                      _drc_9.has_override = false;
                      _drc_9._17_7_ = 0;
                      _drc_9.type = FYET_DEBUG;
                      _drc_9.module = FYEM_UNKNOWN;
                      _drc_9.override_file = (char *)0x0;
                      auStack_2e8._0_4_ = FYET_ERROR;
                      auStack_2e8._4_4_ = FYEM_SCAN;
                      pfVar7 = fy_fill_atom_mark(fyp->current_input,(fy_mark *)&length,
                                                 (fy_mark *)&handle.start_mark.line,
                                                 (fy_atom *)auStack_388);
                      _drc_9._0_8_ = fy_token_create(FYTT_INPUT_MARKER,pfVar7);
                      fy_parser_diag_report
                                (fyp,(fy_diag_report_ctx *)auStack_2e8,"Invalid JSON plain scalar");
                      return -1;
                    }
                  }
                }
              }
            }
            local_358[1] = (char *)0x148d7f;
            fyt_00 = fy_token_queue(fyp,FYTT_SCALAR,&length,0);
            if (fyt_00 == (fy_token *)0x0) {
              local_358[1] = (char *)0x148dba;
              fy_parser_diag(fyp,4,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                             ,0xd7f,"fy_fetch_plain_scalar","fy_token_queue() failed");
              return -1;
            }
            if ((((skm.flow_level._2_1_ & 1) != 0) && (fyp->flow_level == 0)) &&
               ((skm.flow_level._1_1_ & 1) == 0)) {
              blanks_found = 0;
              while( true ) {
                local_358[1] = (char *)0x148dfc;
                handle._52_4_ = fy_parse_peek_at(fyp,blanks_found);
                if (((int)handle._52_4_ < 0) || (handle._52_4_ == 0x3a)) break;
                local_358[1] = (char *)0x148e17;
                _Var3 = fyp_is_lb(fyp,handle._52_4_);
                if (_Var3) break;
                local_358[1] = (char *)0x148e23;
                _Var3 = fy_is_ws(handle._52_4_);
                if (!_Var3) break;
                blanks_found = blanks_found + 1;
              }
              if (handle._52_4_ == 0x3a) {
                _drc_10.fyt = (fy_token *)0x0;
                _drc_10.has_override = false;
                _drc_10._17_7_ = 0;
                _drc_10.type = FYET_DEBUG;
                _drc_10.module = FYEM_UNKNOWN;
                _drc_10.override_file = (char *)0x0;
                auStack_318._0_4_ = FYET_ERROR;
                auStack_318._4_4_ = FYEM_SCAN;
                pfVar7 = fy_fill_atom_mark(fyp->current_input,(fy_mark *)&length,
                                           (fy_mark *)&handle.start_mark.line,(fy_atom *)auStack_388
                                          );
                _drc_10._0_8_ = fy_token_create(FYTT_INPUT_MARKER,pfVar7);
                fy_parser_diag_report
                          (fyp,(fy_diag_report_ctx *)auStack_318,"invalid multiline plain key");
                return -1;
              }
            }
            skm.flow_level._3_1_ = last_ptr._2_1_;
            local_358[1] = (char *)0x148eef;
            iVar4 = fy_save_simple_key_mark
                              (fyp,(fy_simple_key_mark *)&fyt,FYTT_SCALAR,
                               (fy_mark *)&handle.start_mark.line);
            if (iVar4 != 0) {
              local_358[1] = (char *)0x148f22;
              fy_parser_diag(fyp,4,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                             ,0xd96,"fy_fetch_plain_scalar","fy_save_simple_key_mark() failed");
              return iVar4;
            }
            *(ushort *)&fyp->field_0x70 =
                 *(ushort *)&fyp->field_0x70 & 0xfff7 | (ushort)(skm.flow_level._3_1_ & 1) << 3;
            local_358[0] = "false";
            if ((*(ushort *)&fyp->field_0x70 >> 3 & 1) != 0) {
              local_358[0] = "true";
            }
            auStack_388._40_8_ = (fy_input *)0x148fa8;
            fy_parser_diag(fyp,0x20,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                           ,0xd99,"fy_fetch_plain_scalar","simple_key_allowed -> %s\n");
            local_358[1] = (char *)0x148fbc;
            iVar4 = fy_attach_comments_if_any(fyp,fyt_00);
            if (iVar4 == 0) {
              return 0;
            }
            local_358[1] = (char *)0x148fef;
            fy_parser_diag(fyp,4,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                           ,0xd9d,"fy_fetch_plain_scalar","fy_attach_right_hand_comment() failed");
            return iVar4;
          }
          local_328 = _indent;
          local_340 = (fy_atom *)&length;
          local_358[1] = (char *)0x148acf;
          local_338 = fyp;
          pcVar9 = fy_atom_data(local_340);
          local_358[1] = (char *)0x148ae2;
          sVar8 = fy_atom_size(local_340);
          local_358[1] = (char *)0x148b0c;
          iVar4 = fy_utf8_format_text_length(pcVar9,sVar8,fyue_singlequote);
          lVar1 = -((long)iVar4 + 0x10U & 0xfffffffffffffff0);
          *(undefined8 *)((long)local_358 + lVar1 + 8) = 0x148b5c;
          pcVar9 = fy_utf8_format_text(pcVar9,sVar8,acStack_348 + lVar1,(long)iVar4,fyue_singlequote
                                      );
          sVar8 = local_328;
          fyp_00 = local_338;
          *(size_t *)(auStack_388 + lVar1 + 0x20) = local_330;
          *(size_t *)(auStack_388 + lVar1 + 0x28) = sVar8;
          *(char **)(auStack_388 + lVar1 + 0x30) = pcVar9;
          *(undefined8 *)(auStack_388 + lVar1 + 0x18) = 0x148bb7;
          fy_parser_diag(fyp_00,4,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                         ,0xd68,"fy_fetch_plain_scalar",
                         "storage hint calculation failed real %zu != hint %zu - \'%s\'");
        }
      }
      else {
        _drc_5.fyt = (fy_token *)0x0;
        _drc_5.has_override = false;
        _drc_5._17_7_ = 0;
        _drc_5.type = FYET_DEBUG;
        _drc_5.module = FYEM_UNKNOWN;
        _drc_5.override_file = (char *)0x0;
        auStack_1f8._0_4_ = FYET_ERROR;
        auStack_1f8._4_4_ = FYEM_SCAN;
        pfVar7 = fy_fill_atom_at(fyp,0,1,(fy_atom *)auStack_388);
        _drc_5._0_8_ = fy_token_create(FYTT_INPUT_MARKER,pfVar7);
        pcVar9 = "mapping";
        if (fyp->flow == FYFT_SEQUENCE) {
          pcVar9 = "sequence";
        }
        fy_parser_diag_report
                  (fyp,(fy_diag_report_ctx *)auStack_1f8,"wrongly indented flow %s",pcVar9);
      }
    }
    else {
      _drc_2.fyt = (fy_token *)0x0;
      _drc_2.has_override = false;
      _drc_2._17_7_ = 0;
      _drc_2.type = FYET_DEBUG;
      _drc_2.module = FYEM_UNKNOWN;
      _drc_2.override_file = (char *)0x0;
      auStack_168._0_4_ = FYET_ERROR;
      auStack_168._4_4_ = FYEM_SCAN;
      pfVar7 = fy_fill_atom_at(fyp,0,1,(fy_atom *)auStack_388);
      _drc_2._0_8_ = fy_token_create(FYTT_INPUT_MARKER,pfVar7);
      fy_parser_diag_report
                (fyp,(fy_diag_report_ctx *)auStack_168,"plain scalar cannot start with \'%c\'",
                 (ulong)(uint)handle._52_4_);
    }
  }
  return -1;
}

Assistant:

int fy_fetch_plain_scalar(struct fy_parser *fyp, int c) {
    struct fy_atom handle;
    size_t length;
    int rc = -1, indent, run, nextc, i, breaks_found, blanks_found;
    bool has_leading_blanks, had_breaks;
    const char *last_ptr;
    struct fy_mark mark, last_mark;
    bool target_simple_key_allowed, is_multiline, is_complex, has_lb, has_ws;
    bool is_json_unesc, has_json_esc;
    struct fy_simple_key_mark skm;
    struct fy_token *fyt;
#ifdef ATOM_SIZE_CHECK
    size_t tlength;
#endif

    /* may not start with blankz */
    FYP_PARSE_ERROR_CHECK(fyp, 0, 1, FYEM_SCAN,
                          !(fyp->state == FYPS_BLOCK_MAPPING_VALUE && fy_is_tab(c)), err_out,
                          "invalid tab as indendation in a mapping");

    FYP_PARSE_ERROR_CHECK(fyp, 0, 1, FYEM_SCAN,
                          !fyp_is_blankz(fyp, c), err_out,
                          "plain scalar cannot start with blank or zero");

    /* may not start with any of ,[]{}#&*!|>'\"%@` */
    FYP_PARSE_ERROR_CHECK(fyp, 0, 1, FYEM_SCAN,
                          !fy_utf8_strchr(",[]{}#&*!|>'\"%@`", c), err_out,
                          "plain scalar cannot start with '%c'", c);

    /* may not start with - not followed by blankz */
    FYP_PARSE_ERROR_CHECK(fyp, 0, 2, FYEM_SCAN,
                          c != '-' || !fy_is_blank_at_offset(fyp, 1), err_out,
                          "plain scalar cannot start with '%c' followed by blank", c);

    /* may not start with -?: not followed by blankz (in block context) */
    FYP_PARSE_ERROR_CHECK(fyp, 0, 2, FYEM_SCAN,
                          fyp->flow_level ||
                          !((c == '?' || c == ':') &&
                            fy_is_blank_at_offset(fyp, 1)), err_out,
                          "plain scalar cannot start with '%c' followed by blank (in block context)", c);

    /* check indentation */
    FYP_PARSE_ERROR_CHECK(fyp, 0, 1, FYEM_SCAN,
                          !fyp->flow_level || fyp->column > fyp->indent, err_out,
                          "wrongly indented flow %s",
                          fyp->flow == FYFT_SEQUENCE ? "sequence" : "mapping");

    fy_get_mark(fyp, &mark);
    target_simple_key_allowed = false;
    fy_get_simple_key_mark(fyp, &skm);

    fy_fill_atom_start(fyp, &handle);

    has_leading_blanks = false;
    had_breaks = false;
    has_lb = false;
    has_ws = false;
    has_json_esc = false;

    length = 0;
    breaks_found = 0;
    blanks_found = 0;
    indent = fyp->indent + 1;
    last_ptr = NULL;
    memset(&last_mark, 0, sizeof(last_mark));
    c = FYUG_EOF;
    for (;;) {
        /* break for document indicators */
        if (fyp->column == 0 &&
            (!fy_parse_strncmp(fyp, "---", 3) ||
             !fy_parse_strncmp(fyp, "...", 3)) &&
            fy_is_blankz_at_offset(fyp, 3))
            break;

        c = fy_parse_peek(fyp);
        if (c == '#')
            break;

        run = 0;
        for (;;) {
            if (fyp_is_blankz(fyp, c))
                break;

            nextc = fy_parse_peek_at(fyp, 1);

            /* ':' followed by space terminates */
            if (c == ':' && fyp_is_blankz(fyp, nextc))
                break;

            /* in flow context ':' followed by flow markers */
            if (fyp->flow_level && c == ':' && fy_utf8_strchr(",[]{}", nextc))
                break;

            /* in flow context any or , [ ] { } */
            if (fyp->flow_level && (c == ',' || c == '[' || c == ']' || c == '{' || c == '}'))
                break;

            if (breaks_found) {
                /* minimum 1 sep, or more for consecutive */
                length += breaks_found > 1 ? (breaks_found - 1) : 1;
                breaks_found = 0;
                blanks_found = 0;
            } else if (blanks_found) {
                /* just the blanks mam' */
                length += blanks_found;
                blanks_found = 0;
            }

            /* check whether we have a JSON unescaped character */
            is_json_unesc = fy_is_json_unescaped(c);
            if (!is_json_unesc)
                has_json_esc = true;

            fy_advance(fyp, c);
            run++;

            length += fy_utf8_width(c);

            c = nextc;
        }

        /* save end mark if we processed more than one non-blank */
        if (run > 0) {
            /* fyp_scan_debug(fyp, "saving mark"); */
            last_ptr = fyp->current_ptr;
            fy_get_mark(fyp, &last_mark);
        }

        /* end? */
        if (!(fy_is_blank(c) || fyp_is_lb(fyp, c)))
            break;

        has_json_esc = true;

        /* consume blanks */
        breaks_found = 0;
        blanks_found = 0;
        do {
            fy_advance(fyp, c);

            if (!fyp->tabsize) {
                /* check for tab */
                FYP_PARSE_ERROR_CHECK(fyp, 0, 1, FYEM_SCAN,
                                      c != '\t' || !has_leading_blanks || fyp->column >= indent, err_out,
                                      "invalid tab used as indentation");
            }

            nextc = fy_parse_peek(fyp);

            /* if it's a break */
            if (fyp_is_lb(fyp, c)) {
                /* first break, turn on leading blanks */
                if (!has_leading_blanks)
                    has_leading_blanks = true;
                had_breaks = true;
                breaks_found++;
                blanks_found = 0;
                has_lb = true;
            } else {
                blanks_found++;
                has_ws = true;
            }

            c = nextc;

        } while (fy_is_blank(c) || fyp_is_lb(fyp, c));

        /* break out if indentation is less */
        if (!fyp->flow_level && fyp->column < indent)
            break;
    }

    /* end... */
    if (!last_ptr)
        fy_fill_atom_end(fyp, &handle);
    else
        fy_fill_atom_end_at(fyp, &handle, &last_mark);

    if (c == FYUG_INV || c == FYUG_PARTIAL) {
        FYP_MARK_ERROR(fyp, &handle.start_mark, &handle.end_mark, FYEM_SCAN,
                       "plain scalar is malformed UTF8");
        goto err_out;
    }

    is_multiline = handle.end_mark.line > handle.start_mark.line;
    is_complex = fyp->pending_complex_key_column >= 0;

    handle.style = FYAS_PLAIN;
    handle.chomp = FYAC_STRIP;
    handle.direct_output = !is_multiline && !has_json_esc && fy_atom_size(&handle) == length;
    handle.empty = false;
    handle.has_lb = has_lb;
    handle.has_ws = has_ws;
    handle.starts_with_ws = false;
    handle.starts_with_lb = false;
    handle.ends_with_ws = false;
    handle.ends_with_lb = false;
    handle.trailing_lb = false;
    handle.size0 = length == 0;
    handle.valid_anchor = false;
    handle.tabsize = fyp->tabsize;

#ifdef ATOM_SIZE_CHECK
    tlength = fy_atom_format_text_length(&handle);
    fyp_error_check(fyp,
                    tlength == length,
                    err_out, "storage hint calculation failed real %zu != hint %zu - '%s'",
                    tlength, length,
                    fy_utf8_format_text_a(fy_atom_data(&handle), fy_atom_size(&handle), fyue_singlequote));
#endif

    handle.storage_hint = length;
    handle.storage_hint_valid = true;

    /* extra check in json mode */
    if (fyp_json_mode(fyp)) {
        FYP_MARK_ERROR_CHECK(fyp, &handle.start_mark, &handle.end_mark, FYEM_SCAN,
                             !is_multiline, err_out,
                             "Multi line plain scalars not supported in JSON mode");

        FYP_MARK_ERROR_CHECK(fyp, &handle.start_mark, &handle.end_mark, FYEM_SCAN,
                             !fy_atom_strcmp(&handle, "false") ||
                             !fy_atom_strcmp(&handle, "true") ||
                             !fy_atom_strcmp(&handle, "null") ||
                             fy_atom_is_number(&handle), err_out,
                             "Invalid JSON plain scalar");
    }

    /* and we're done */
    fyt = fy_token_queue(fyp, FYTT_SCALAR, &handle, FYSS_PLAIN);
    fyp_error_check(fyp, fyt, err_out_rc,
                    "fy_token_queue() failed");

    if (is_multiline && !fyp->flow_level && !is_complex) {
        /* due to the weirdness with simple keys scan forward
		* until a linebreak, ';', or anything else */
        for (i = 0;; i++) {
            c = fy_parse_peek_at(fyp, i);
            if (c < 0 || c == ':' || fyp_is_lb(fyp, c) || !fy_is_ws(c))
                break;
        }

        /* if we're a key, that's invalid */
        if (c == ':') {
            FYP_MARK_ERROR(fyp, &handle.start_mark, &handle.end_mark, FYEM_SCAN,
                           "invalid multiline plain key");
            goto err_out;
        }
    }

    target_simple_key_allowed = had_breaks;

    rc = fy_save_simple_key_mark(fyp, &skm, FYTT_SCALAR, &handle.end_mark);
    fyp_error_check(fyp, !rc, err_out_rc,
                    "fy_save_simple_key_mark() failed");

    fyp->simple_key_allowed = target_simple_key_allowed;
    fyp_scan_debug(fyp, "simple_key_allowed -> %s\n", fyp->simple_key_allowed ? "true" : "false");

    rc = fy_attach_comments_if_any(fyp, fyt);
    fyp_error_check(fyp, !rc, err_out_rc,
                    "fy_attach_right_hand_comment() failed");

    return 0;

    err_out:
    rc = -1;
    err_out_rc:
    return rc;
}